

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.c
# Opt level: O1

int uv_signal_start(uv_signal_t *handle,uv_signal_cb signal_cb,int signum)

{
  uint *puVar1;
  uv__signal_tree_s uVar2;
  int iVar3;
  uv_signal_t *puVar4;
  int *piVar5;
  uv_signal_s *puVar6;
  uv_signal_s *puVar7;
  uv_signal_s *puVar8;
  uint uVar9;
  long lVar10;
  uv_signal_s *puVar11;
  anon_struct_32_4_548b78d9_for_tree_entry *paVar12;
  int iVar13;
  sigset_t saved_sigmask;
  sigset_t sStack_138;
  sigaction local_b8;
  
  if ((handle->flags & 3) != 0) {
    __assert_fail("!(handle->flags & (UV_CLOSING | UV_CLOSED))","src/unix/signal.c",0x123,
                  "int uv_signal_start(uv_signal_t *, uv_signal_cb, int)");
  }
  if (signum == 0) {
    iVar13 = -0x16;
  }
  else if (handle->signum == signum) {
    handle->signal_cb = signal_cb;
    iVar13 = 0;
  }
  else {
    if (handle->signum != 0) {
      uv__signal_stop(handle);
    }
    uv__signal_block_and_lock(&sStack_138);
    puVar4 = uv__signal_first_handle(signum);
    if (puVar4 == (uv_signal_t *)0x0) {
      iVar13 = 0;
      memset(&local_b8,0,0x98);
      iVar3 = sigfillset(&local_b8.sa_mask);
      if (iVar3 != 0) {
        abort();
      }
      local_b8.__sigaction_handler.sa_handler = uv__signal_handler;
      iVar3 = sigaction(signum,&local_b8,(sigaction *)0x0);
      if (iVar3 != 0) {
        piVar5 = __errno_location();
        iVar13 = -*piVar5;
      }
      if (iVar13 != 0) {
        uv__signal_unlock_and_unblock(&sStack_138);
        return iVar13;
      }
    }
    handle->signum = signum;
    uVar2 = uv__signal_tree;
    if (uv__signal_tree.rbh_root == (uv_signal_s *)0x0) {
      lVar10 = 0x58;
      puVar6 = (uv_signal_s *)0x0;
    }
    else {
      do {
        puVar6 = uVar2.rbh_root;
        if (signum < puVar6->signum) {
LAB_0010e5a5:
          uVar9 = 0xffffffff;
        }
        else {
          uVar9 = 1;
          if (signum <= puVar6->signum) {
            if (handle->loop < puVar6->loop) goto LAB_0010e5a5;
            if (handle->loop <= puVar6->loop) {
              uVar9 = 0xffffffff;
              if (puVar6 <= handle) {
                uVar9 = (uint)(puVar6 < handle);
              }
            }
          }
        }
        if ((int)uVar9 < 0) {
          lVar10 = 0x50;
        }
        else {
          lVar10 = 0x58;
          if (uVar9 == 0) goto LAB_0010e86a;
        }
        uVar2.rbh_root = *(uv_signal_s **)((long)puVar6->handle_queue + lVar10 + -0x20);
      } while (uVar2.rbh_root != (uv_signal_s *)0x0);
      lVar10 = (ulong)(~uVar9 >> 0x1f) * 8 + 0x50;
    }
    (handle->tree_entry).rbe_parent = puVar6;
    (handle->tree_entry).rbe_left = (uv_signal_s *)0x0;
    (handle->tree_entry).rbe_right = (uv_signal_s *)0x0;
    (handle->tree_entry).rbe_color = 1;
    uVar2.rbh_root = handle;
    if (puVar6 != (uv_signal_s *)0x0) {
      *(uv_signal_t **)((long)puVar6->handle_queue + lVar10 + -0x20) = handle;
      puVar4 = handle;
      do {
        uVar2.rbh_root = uv__signal_tree.rbh_root;
        if ((puVar6->tree_entry).rbe_color != 1) break;
        puVar8 = (puVar6->tree_entry).rbe_parent;
        puVar11 = (puVar8->tree_entry).rbe_left;
        puVar7 = puVar4;
        if (puVar6 == puVar11) {
          puVar11 = (puVar8->tree_entry).rbe_right;
          if ((puVar11 != (uv_signal_s *)0x0) && ((puVar11->tree_entry).rbe_color == 1))
          goto LAB_0010e6e8;
          puVar11 = (puVar6->tree_entry).rbe_right;
          if (puVar11 == puVar4) {
            puVar7 = (puVar11->tree_entry).rbe_left;
            (puVar6->tree_entry).rbe_right = puVar7;
            if (puVar7 != (uv_signal_s *)0x0) {
              (puVar7->tree_entry).rbe_parent = puVar6;
            }
            puVar7 = (puVar6->tree_entry).rbe_parent;
            (puVar11->tree_entry).rbe_parent = puVar7;
            paVar12 = (anon_struct_32_4_548b78d9_for_tree_entry *)&uv__signal_tree;
            if (puVar7 != (uv_signal_s *)0x0) {
              puVar7 = (puVar6->tree_entry).rbe_parent;
              paVar12 = (anon_struct_32_4_548b78d9_for_tree_entry *)&(puVar7->tree_entry).rbe_right;
              if (puVar6 == (puVar7->tree_entry).rbe_left) {
                paVar12 = &puVar7->tree_entry;
              }
            }
            paVar12->rbe_left = puVar11;
            (puVar11->tree_entry).rbe_left = puVar6;
            (puVar6->tree_entry).rbe_parent = puVar11;
            puVar7 = puVar6;
            puVar6 = puVar4;
          }
          (puVar6->tree_entry).rbe_color = 0;
          (puVar8->tree_entry).rbe_color = 1;
          puVar6 = (puVar8->tree_entry).rbe_left;
          puVar11 = (puVar6->tree_entry).rbe_right;
          (puVar8->tree_entry).rbe_left = puVar11;
          if (puVar11 != (uv_signal_s *)0x0) {
            (puVar11->tree_entry).rbe_parent = puVar8;
          }
          puVar11 = (puVar8->tree_entry).rbe_parent;
          (puVar6->tree_entry).rbe_parent = puVar11;
          paVar12 = (anon_struct_32_4_548b78d9_for_tree_entry *)&uv__signal_tree;
          if (puVar11 != (uv_signal_s *)0x0) {
            puVar11 = (puVar8->tree_entry).rbe_parent;
            paVar12 = (anon_struct_32_4_548b78d9_for_tree_entry *)&(puVar11->tree_entry).rbe_right;
            if (puVar8 == (puVar11->tree_entry).rbe_left) {
              paVar12 = &puVar11->tree_entry;
            }
          }
          paVar12->rbe_left = puVar6;
          (puVar6->tree_entry).rbe_right = puVar8;
LAB_0010e83f:
          (puVar8->tree_entry).rbe_parent = puVar6;
          puVar8 = puVar7;
        }
        else {
          if ((puVar11 == (uv_signal_s *)0x0) || ((puVar11->tree_entry).rbe_color != 1)) {
            puVar11 = (puVar6->tree_entry).rbe_left;
            if (puVar11 == puVar4) {
              puVar7 = (puVar11->tree_entry).rbe_right;
              (puVar6->tree_entry).rbe_left = puVar7;
              if (puVar7 != (uv_signal_s *)0x0) {
                (puVar7->tree_entry).rbe_parent = puVar6;
              }
              puVar7 = (puVar6->tree_entry).rbe_parent;
              (puVar11->tree_entry).rbe_parent = puVar7;
              paVar12 = (anon_struct_32_4_548b78d9_for_tree_entry *)&uv__signal_tree;
              if (puVar7 != (uv_signal_s *)0x0) {
                puVar7 = (puVar6->tree_entry).rbe_parent;
                paVar12 = (anon_struct_32_4_548b78d9_for_tree_entry *)
                          &(puVar7->tree_entry).rbe_right;
                if (puVar6 == (puVar7->tree_entry).rbe_left) {
                  paVar12 = &puVar7->tree_entry;
                }
              }
              paVar12->rbe_left = puVar11;
              (puVar11->tree_entry).rbe_right = puVar6;
              (puVar6->tree_entry).rbe_parent = puVar11;
              puVar7 = puVar6;
              puVar6 = puVar4;
            }
            (puVar6->tree_entry).rbe_color = 0;
            (puVar8->tree_entry).rbe_color = 1;
            puVar6 = (puVar8->tree_entry).rbe_right;
            puVar11 = (puVar6->tree_entry).rbe_left;
            (puVar8->tree_entry).rbe_right = puVar11;
            if (puVar11 != (uv_signal_s *)0x0) {
              (puVar11->tree_entry).rbe_parent = puVar8;
            }
            puVar11 = (puVar8->tree_entry).rbe_parent;
            (puVar6->tree_entry).rbe_parent = puVar11;
            paVar12 = (anon_struct_32_4_548b78d9_for_tree_entry *)&uv__signal_tree;
            if (puVar11 != (uv_signal_s *)0x0) {
              puVar11 = (puVar8->tree_entry).rbe_parent;
              paVar12 = (anon_struct_32_4_548b78d9_for_tree_entry *)&(puVar11->tree_entry).rbe_right
              ;
              if (puVar8 == (puVar11->tree_entry).rbe_left) {
                paVar12 = &puVar11->tree_entry;
              }
            }
            paVar12->rbe_left = puVar6;
            (puVar6->tree_entry).rbe_left = puVar8;
            goto LAB_0010e83f;
          }
LAB_0010e6e8:
          (puVar11->tree_entry).rbe_color = 0;
          (puVar6->tree_entry).rbe_color = 0;
          (puVar8->tree_entry).rbe_color = 1;
        }
        puVar6 = (puVar8->tree_entry).rbe_parent;
        puVar4 = puVar8;
        uVar2.rbh_root = uv__signal_tree.rbh_root;
      } while (puVar6 != (uv_signal_s *)0x0);
    }
    uv__signal_tree.rbh_root = uVar2.rbh_root;
    ((uv__signal_tree.rbh_root)->tree_entry).rbe_color = 0;
LAB_0010e86a:
    uv__signal_unlock_and_unblock(&sStack_138);
    handle->signal_cb = signal_cb;
    uVar9 = handle->flags;
    iVar13 = 0;
    if (((uVar9 >> 0xe & 1) == 0) && (handle->flags = uVar9 | 0x4000, (uVar9 >> 0xd & 1) != 0)) {
      puVar1 = &handle->loop->active_handles;
      *puVar1 = *puVar1 + 1;
    }
  }
  return iVar13;
}

Assistant:

int uv_signal_start(uv_signal_t* handle, uv_signal_cb signal_cb, int signum) {
  sigset_t saved_sigmask;
  int err;

  assert(!(handle->flags & (UV_CLOSING | UV_CLOSED)));

  /* If the user supplies signum == 0, then return an error already. If the
   * signum is otherwise invalid then uv__signal_register will find out
   * eventually.
   */
  if (signum == 0)
    return -EINVAL;

  /* Short circuit: if the signal watcher is already watching {signum} don't
   * go through the process of deregistering and registering the handler.
   * Additionally, this avoids pending signals getting lost in the small time
   * time frame that handle->signum == 0.
   */
  if (signum == handle->signum) {
    handle->signal_cb = signal_cb;
    return 0;
  }

  /* If the signal handler was already active, stop it first. */
  if (handle->signum != 0) {
    uv__signal_stop(handle);
  }

  uv__signal_block_and_lock(&saved_sigmask);

  /* If at this point there are no active signal watchers for this signum (in
   * any of the loops), it's time to try and register a handler for it here.
   */
  if (uv__signal_first_handle(signum) == NULL) {
    err = uv__signal_register_handler(signum);
    if (err) {
      /* Registering the signal handler failed. Must be an invalid signal. */
      uv__signal_unlock_and_unblock(&saved_sigmask);
      return err;
    }
  }

  handle->signum = signum;
  RB_INSERT(uv__signal_tree_s, &uv__signal_tree, handle);

  uv__signal_unlock_and_unblock(&saved_sigmask);

  handle->signal_cb = signal_cb;
  uv__handle_start(handle);

  return 0;
}